

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# direct_access.c
# Opt level: O3

ecs_record_t
ecs_table_insert(ecs_world_t *world,ecs_table_t *table,ecs_entity_t entity,ecs_record_t *record)

{
  int32_t iVar1;
  ecs_data_t *data;
  ecs_record_t eVar2;
  
  data = ecs_table_get_or_create_data(table);
  iVar1 = ecs_table_append(world,table,data,entity,record,true);
  if (record != (ecs_record_t *)0x0) {
    record->table = table;
    record->row = iVar1 + 1;
  }
  eVar2.row = iVar1 + 1;
  eVar2.table = table;
  eVar2._12_4_ = 0;
  return eVar2;
}

Assistant:

ecs_record_t ecs_table_insert(
    ecs_world_t *world,
    ecs_table_t *table,
    ecs_entity_t entity,
    ecs_record_t *record)
{
    ecs_data_t *data = ecs_table_get_or_create_data(table);
    int32_t index = ecs_table_append(world, table, data, entity, record, true);
    if (record) {
        record->table = table;
        record->row = index + 1;
    }
    return (ecs_record_t){table, index + 1};
}